

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.c
# Opt level: O0

void mbedtls_mpi_core_cond_assign
               (mbedtls_mpi_uint *X,mbedtls_mpi_uint *A,size_t limbs,mbedtls_ct_condition_t assign)

{
  mbedtls_mpi_uint mVar1;
  ulong local_30;
  size_t i;
  mbedtls_ct_condition_t assign_local;
  size_t limbs_local;
  mbedtls_mpi_uint *A_local;
  mbedtls_mpi_uint *X_local;
  
  if (X != A) {
    for (local_30 = 0; local_30 < limbs; local_30 = local_30 + 1) {
      mVar1 = mbedtls_ct_mpi_uint_if(assign,A[local_30],X[local_30]);
      X[local_30] = mVar1;
    }
  }
  return;
}

Assistant:

void mbedtls_mpi_core_cond_assign(mbedtls_mpi_uint *X,
                                  const mbedtls_mpi_uint *A,
                                  size_t limbs,
                                  mbedtls_ct_condition_t assign)
{
    if (X == A) {
        return;
    }

    /* This function is very performance-sensitive for RSA. For this reason
     * we have the loop below, instead of calling mbedtls_ct_memcpy_if
     * (this is more optimal since here we don't have to handle the case where
     * we copy awkwardly sized data).
     */
    for (size_t i = 0; i < limbs; i++) {
        X[i] = mbedtls_ct_mpi_uint_if(assign, A[i], X[i]);
    }
}